

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O1

void __thiscall Vector<long_double>::Vector(Vector<long_double> *this,int csize,longdouble *val)

{
  longdouble *plVar1;
  longdouble *plVar2;
  
  this->num_elts = 0;
  this->ptr_to_data = (longdouble *)0x0;
  if (0 < csize) {
    this->num_elts = csize;
    plVar1 = (longdouble *)operator_new__((ulong)(uint)csize << 4);
    this->ptr_to_data = plVar1;
  }
  if (0 < (long)this->num_elts) {
    plVar1 = this->ptr_to_data;
    plVar2 = plVar1 + this->num_elts;
    do {
      plVar2[-1] = *val;
      plVar2 = plVar2 + -1;
    } while (plVar1 < plVar2);
  }
  return;
}

Assistant:

Vector< T >::Vector(int csize, const T& val) : num_elts(0), ptr_to_data((T*)0)
{
#ifdef DEBUG
	std::cerr << "Vector<>::Vector(int, const T& )|size constructor   |";
#endif

    if (csize > 0 ){
	num_elts = csize;
	ptr_to_data = new T[num_elts];

	if ( ptr_to_data == 0 ) error("Vector<>::Vector(), Memoire insuffisante");
    } 

  T* p = ptr_to_data + num_elts;
  while ( p > ptr_to_data ) 
    *--p = val;//pb si = n'est pas surcharge pour le type T

#ifdef DEBUG
    fprintf(stderr," adr =  %x \n", ptr_to_data);
#endif
}